

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::TestMessageWithCustomOptions::ByteSizeLong(TestMessageWithCustomOptions *this)

{
  bool bVar1;
  int size;
  AnOneofCase AVar2;
  int32_t value;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  reference key;
  uint32_t *puVar3;
  string *value_00;
  size_t sVar4;
  value_type *entry;
  const_iterator __end2;
  const_iterator __begin2;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestMessageWithCustomOptions *this_;
  TestMessageWithCustomOptions *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  size = _internal_map_field_size(this);
  sStack_58 = google::protobuf::internal::FromIntSize(size);
  this_00 = _internal_map_field_abi_cxx11_(this);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::begin((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,this_00);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::end((const_iterator *)&entry,this_00);
  while (bVar1 = google::protobuf::operator!=
                           ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,
                            (const_iterator *)&entry), bVar1) {
    key = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::const_iterator::operator*
                    ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
    sVar4 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            ::ByteSizeLong(&key->first,&key->second);
    sStack_58 = sVar4 + sStack_58;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::const_iterator::operator++((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar3 & 1) != 0) {
    value_00 = _internal_field1_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
    sStack_58 = sVar4 + 1 + sStack_58;
  }
  AVar2 = AnOneof_case(this);
  if ((AVar2 != ANONEOF_NOT_SET) && (AVar2 == kOneofField)) {
    value = _internal_oneof_field(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
    sStack_58 = sVar4 + sStack_58;
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t TestMessageWithCustomOptions::ByteSizeLong() const {
  const TestMessageWithCustomOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMessageWithCustomOptions)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<string, string> map_field = 3 [(.proto2_unittest.field_opt1) = 12345];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_field_size());
      for (const auto& entry : this_._internal_map_field()) {
        total_size += _pbi::MapEntryFuncs<std::string, std::string,
                                       _pbi::WireFormatLite::TYPE_STRING,
                                       _pbi::WireFormatLite::TYPE_STRING>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
   {
    // optional string field1 = 1 [ctype = CORD, (.proto2_unittest.field_opt1) = 8765432109];
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_field1());
    }
  }
  switch (this_.AnOneof_case()) {
    // int32 oneof_field = 2;
    case kOneofField: {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_oneof_field());
      break;
    }
    case ANONEOF_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}